

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O3

void Refresh(CPpmd8 *p,CTX_PTR ctx,uint oldNU,uint scale)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar7 = (uint)ctx->NumStats;
  pbVar1 = (byte *)ShrinkUnits(p,p->Base + ctx->Stats,oldNU,ctx->NumStats + 2 >> 1);
  ctx->Stats = (int)pbVar1 - *(int *)&p->Base;
  iVar3 = (uint)ctx->SummFreq - (uint)pbVar1[1];
  bVar2 = (byte)scale;
  uVar5 = pbVar1[1] + scale >> (bVar2 & 0x1f);
  uVar4 = (scale * 4 + 0x10 & (uint)ctx->Flags) + (uint)(0x3f < *pbVar1) * 8;
  pbVar1[1] = (byte)uVar5;
  uVar5 = uVar5 & 0xff;
  pbVar1 = pbVar1 + 7;
  do {
    iVar3 = iVar3 - (uint)*pbVar1;
    uVar6 = *pbVar1 + scale >> (bVar2 & 0x1f);
    *pbVar1 = (byte)uVar6;
    uVar5 = uVar5 + (uVar6 & 0xff);
    uVar4 = uVar4 | (uint)(0x3f < pbVar1[-1]) << 3;
    pbVar1 = pbVar1 + 6;
    uVar7 = uVar7 - 1;
  } while (uVar7 != 0);
  ctx->SummFreq = (short)uVar5 + (short)(iVar3 + scale >> (bVar2 & 0x1f));
  ctx->Flags = (Byte)uVar4;
  return;
}

Assistant:

static void Refresh(CPpmd8 *p, CTX_PTR ctx, unsigned oldNU, unsigned scale)
{
  unsigned i = ctx->NumStats, escFreq, sumFreq, flags;
  CPpmd_State *s = (CPpmd_State *)ShrinkUnits(p, STATS(ctx), oldNU, (i + 2) >> 1);
  ctx->Stats = REF(s);
  #ifdef PPMD8_FREEZE_SUPPORT
  /* fixed over Shkarin's code. Fixed code is not compatible with original code for some files in FREEZE mode. */
  scale |= (ctx->SummFreq >= ((UInt32)1 << 15));
  #endif
  flags = (ctx->Flags & (0x10 + 0x04 * scale)) + 0x08 * (s->Symbol >= 0x40);
  escFreq = ctx->SummFreq - s->Freq;
  sumFreq = (s->Freq = (Byte)((s->Freq + scale) >> scale));
  do
  {
    escFreq -= (++s)->Freq;
    sumFreq += (s->Freq = (Byte)((s->Freq + scale) >> scale));
    flags |= 0x08 * (s->Symbol >= 0x40);
  }
  while (--i);
  ctx->SummFreq = (UInt16)(sumFreq + ((escFreq + scale) >> scale));
  ctx->Flags = (Byte)flags;
}